

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::DirectoryContentsTask::start
          (DirectoryContentsTask *this,TaskInterface ti)

{
  size_t in_RCX;
  StringRef path;
  TaskInterface local_68;
  string local_58 [32];
  string local_38 [32];
  
  local_68.ctx = ti.ctx;
  local_68.impl = ti.impl;
  path.Length = in_RCX;
  path.Data = (char *)(this->path)._M_string_length;
  llbuild::buildsystem::BuildKey::makeNode
            ((BuildKey *)local_58,(BuildKey *)(this->path)._M_dataplus._M_p,path);
  std::__cxx11::string::string(local_38,local_58);
  llbuild::core::TaskInterface::request(&local_68,(KeyType *)local_38,0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the base directory node -- this task doesn't actually use the
    // value, but this connects the task to its producer if present.

    // FIXME:
    //
    //engine.taskMustFollow(this, BuildKey::makeNode(path).toData());
    //
    // The taskMustFollow method expresses the weak dependency we have on
    // 'path', but only at the task level. What we really want is to say at the
    // 'isResultValid'/scanning level is 'must scan after'. That way we hold up
    // this and downstream rules until the 'path' node has been set into its
    // final state*.
    //
    // With the explicit dependency we are establishing with request(), we
    // will unfortunately mark directory contents as 'needs to be built' under
    // situations where non-releveant stat info has changed. This causes
    // unnecessary rebuilds. See rdar://problem/30640904
    //
    // * The 'final state' of a directory is also a thorny patch of toxic land
    // mines. We really want directory contents to weakly depend upon anything
    // that is currently and/or may be altered within it. i.e. if one rule
    // creates the directory and another rule writes a file into it, we want to
    // defer scanning until both of them have been scanned and possibly run.
    // Having a 'must scan after' would help with the first rule (mkdir), but
    // not the second, in particular if rules are added in subsequent builds.
    // Related rdar://problem/30638921
    //
    ti.request(BuildKey::makeNode(path).toData(), /*inputID=*/0);
  }